

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# basic_block.cpp
# Opt level: O2

bool __thiscall
spvtools::val::BasicBlock::structurally_postdominates(BasicBlock *this,BasicBlock *other)

{
  bool bVar1;
  BasicBlock *local_a0;
  DominatorIterator local_98;
  DominatorIterator local_68;
  DominatorIterator local_40;
  
  if (this == other) {
    bVar1 = true;
  }
  else {
    structural_pdom_begin(&local_68,other);
    local_98.dom_func_._M_invoker = (_Invoker_type)0x0;
    local_98.dom_func_.super__Function_base._M_functor._8_8_ = 0;
    local_98.dom_func_.super__Function_base._M_manager = (_Manager_type)0x0;
    local_98.current_ = (BasicBlock *)0x0;
    local_98.dom_func_.super__Function_base._M_functor._M_unused._M_object = (void *)0x0;
    local_a0 = this;
    std::find<spvtools::val::BasicBlock::DominatorIterator,spvtools::val::BasicBlock_const*>
              (&local_40,&local_68,&local_98,&local_a0);
    bVar1 = local_40.current_ != (BasicBlock *)0x0;
    if (local_40.dom_func_.super__Function_base._M_manager != (_Manager_type)0x0) {
      (*local_40.dom_func_.super__Function_base._M_manager)
                ((_Any_data *)&local_40.dom_func_,(_Any_data *)&local_40.dom_func_,__destroy_functor
                );
    }
    if (local_98.dom_func_.super__Function_base._M_manager != (_Manager_type)0x0) {
      (*local_98.dom_func_.super__Function_base._M_manager)
                ((_Any_data *)&local_98.dom_func_,(_Any_data *)&local_98.dom_func_,__destroy_functor
                );
    }
    if (local_68.dom_func_.super__Function_base._M_manager != (_Manager_type)0x0) {
      (*local_68.dom_func_.super__Function_base._M_manager)
                ((_Any_data *)&local_68.dom_func_,(_Any_data *)&local_68.dom_func_,__destroy_functor
                );
    }
  }
  return bVar1;
}

Assistant:

bool BasicBlock::structurally_postdominates(const BasicBlock& other) const {
  return (this == &other) || !(other.structural_pdom_end() ==
                               std::find(other.structural_pdom_begin(),
                                         other.structural_pdom_end(), this));
}